

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall
httplib::Server::write_content_with_provider
          (Server *this,Stream *strm,Request *req,Response *res,string *boundary,
          string *content_type)

{
  pointer ppVar1;
  pointer ppVar2;
  bool bVar3;
  ssize_t sVar4;
  function<void_(unsigned_long,_unsigned_long,_std::function<void_(const_char_*,_unsigned_long)>,_std::function<void_()>)>
  *this_00;
  pair<unsigned_long,_unsigned_long> pVar5;
  function<void_(unsigned_long,_unsigned_long,_std::function<void_(const_char_*,_unsigned_long)>,_std::function<void_()>)>
  fStack_88;
  function<void_(unsigned_long,_unsigned_long,_std::function<void_(const_char_*,_unsigned_long)>,_std::function<void_()>)>
  local_68;
  function<void_(unsigned_long,_unsigned_long,_std::function<void_(const_char_*,_unsigned_long)>,_std::function<void_()>)>
  local_48;
  
  this_00 = &fStack_88;
  if (res->content_length == 0) {
    std::
    function<void_(unsigned_long,_unsigned_long,_std::function<void_(const_char_*,_unsigned_long)>,_std::function<void_()>)>
    ::function(&fStack_88,&res->content_provider);
    sVar4 = detail::write_content_chunked(strm,&fStack_88);
  }
  else {
    ppVar1 = (req->ranges).
             super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (req->ranges).
             super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (ppVar1 == ppVar2) {
      std::
      function<void_(unsigned_long,_unsigned_long,_std::function<void_(const_char_*,_unsigned_long)>,_std::function<void_()>)>
      ::function(&local_48,&res->content_provider);
      sVar4 = detail::write_content(strm,&local_48,0,res->content_length);
      this_00 = &local_48;
    }
    else {
      if ((long)ppVar2 - (long)ppVar1 != 0x10) {
        bVar3 = detail::write_multipart_ranges_data(strm,req,res,boundary,content_type);
        if (bVar3) {
          return true;
        }
        return false;
      }
      pVar5 = detail::get_range_offset_and_length(req,res->content_length,0);
      std::
      function<void_(unsigned_long,_unsigned_long,_std::function<void_(const_char_*,_unsigned_long)>,_std::function<void_()>)>
      ::function(&local_68,&res->content_provider);
      sVar4 = detail::write_content(strm,&local_68,pVar5.first,pVar5.second);
      this_00 = &local_68;
    }
  }
  std::_Function_base::~_Function_base(&this_00->super__Function_base);
  if (-1 < sVar4) {
    return true;
  }
  return false;
}

Assistant:

inline bool
Server::write_content_with_provider(Stream &strm, const Request &req,
                                    Response &res, const std::string &boundary,
                                    const std::string &content_type) {
  if (res.content_length) {
    if (req.ranges.empty()) {
      if (detail::write_content(strm, res.content_provider, 0,
                                res.content_length) < 0) {
        return false;
      }
    } else if (req.ranges.size() == 1) {
      auto offsets =
          detail::get_range_offset_and_length(req, res.content_length, 0);
      auto offset = offsets.first;
      auto length = offsets.second;
      if (detail::write_content(strm, res.content_provider, offset, length) <
          0) {
        return false;
      }
    } else {
      if (!detail::write_multipart_ranges_data(strm, req, res, boundary,
                                               content_type)) {
        return false;
      }
    }
  } else {
    if (detail::write_content_chunked(strm, res.content_provider) < 0) {
      return false;
    }
  }
  return true;
}